

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# least.cpp
# Opt level: O1

void duckdb::
     LeastGreatestFunction<duckdb::hugeint_t,duckdb::GreaterThan,duckdb::StandardLeastGreatest<false>>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  data_ptr_t pdVar1;
  unsigned_long *puVar2;
  sel_t *psVar3;
  ulong uVar4;
  long lVar5;
  reference pvVar6;
  long *plVar7;
  VectorType vector_type_p;
  ulong uVar8;
  ulong uVar9;
  size_type sVar10;
  UnifiedVectorFormat vdata;
  bool result_has_value [2048];
  UnifiedVectorFormat local_880;
  bool local_838 [2056];
  
  if ((long)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
            super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
            super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
            super__Vector_impl_data._M_start == 0x68) {
    pvVar6 = vector<duckdb::Vector,_true>::operator[](&args->data,0);
    Vector::Reference(result,pvVar6);
    return;
  }
  vector_type_p = CONSTANT_VECTOR;
  if ((args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_start) {
    sVar10 = 0;
    vector_type_p = CONSTANT_VECTOR;
    do {
      pvVar6 = vector<duckdb::Vector,_true>::operator[](&args->data,sVar10);
      if (pvVar6->vector_type != CONSTANT_VECTOR) {
        vector_type_p = FLAT_VECTOR;
      }
      sVar10 = sVar10 + 1;
    } while (sVar10 < (ulong)(((long)(args->data).
                                     super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                     super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(args->data).
                                     super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                     super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) *
                             0x4ec4ec4ec4ec4ec5));
  }
  pdVar1 = result->data;
  switchD_005700f1::default(local_838,0,0x800);
  if ((args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_start) {
    sVar10 = 0;
    do {
      pvVar6 = vector<duckdb::Vector,_true>::operator[](&args->data,sVar10);
      if (pvVar6->vector_type == CONSTANT_VECTOR) {
        pvVar6 = vector<duckdb::Vector,_true>::operator[](&args->data,sVar10);
        puVar2 = (pvVar6->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar2 == (unsigned_long *)0x0) || ((*puVar2 & 1) != 0)) goto LAB_00fa6814;
      }
      else {
LAB_00fa6814:
        UnifiedVectorFormat::UnifiedVectorFormat(&local_880);
        pvVar6 = vector<duckdb::Vector,_true>::operator[](&args->data,sVar10);
        Vector::ToUnifiedFormat(pvVar6,args->count,&local_880);
        if (local_880.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          if (args->count != 0) {
            psVar3 = (local_880.sel)->sel_vector;
            uVar8 = 0;
            plVar7 = (long *)(pdVar1 + 8);
            do {
              uVar9 = uVar8;
              if (psVar3 != (sel_t *)0x0) {
                uVar9 = (ulong)psVar3[uVar8];
              }
              uVar4 = *(ulong *)(local_880.data + uVar9 * 0x10);
              lVar5 = *(long *)(local_880.data + uVar9 * 0x10 + 8);
              if (local_838[uVar8] == true) {
                if ((*plVar7 < lVar5) || ((ulong)plVar7[-1] < uVar4 && lVar5 == *plVar7))
                goto LAB_00fa6917;
              }
              else {
LAB_00fa6917:
                local_838[uVar8] = true;
                plVar7[-1] = uVar4;
                *plVar7 = lVar5;
              }
              uVar8 = uVar8 + 1;
              plVar7 = plVar7 + 2;
            } while (uVar8 < args->count);
          }
        }
        else if (args->count != 0) {
          psVar3 = (local_880.sel)->sel_vector;
          uVar8 = 0;
          plVar7 = (long *)(pdVar1 + 8);
          do {
            uVar9 = uVar8;
            if (psVar3 != (sel_t *)0x0) {
              uVar9 = (ulong)psVar3[uVar8];
            }
            if ((local_880.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                 [uVar9 >> 6] >> (uVar9 & 0x3f) & 1) != 0) {
              uVar4 = *(ulong *)(local_880.data + uVar9 * 0x10);
              lVar5 = *(long *)(local_880.data + uVar9 * 0x10 + 8);
              if (local_838[uVar8] == true) {
                if ((lVar5 <= *plVar7) && (uVar4 <= (ulong)plVar7[-1] || lVar5 != *plVar7))
                goto LAB_00fa68b9;
              }
              local_838[uVar8] = true;
              plVar7[-1] = uVar4;
              *plVar7 = lVar5;
            }
LAB_00fa68b9:
            uVar8 = uVar8 + 1;
            plVar7 = plVar7 + 2;
          } while (uVar8 < args->count);
        }
        if (local_880.owned_sel.selection_data.internal.
            super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_880.owned_sel.selection_data.internal.
                     super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_880.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_880.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                     internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
      }
      sVar10 = sVar10 + 1;
    } while (sVar10 < (ulong)(((long)(args->data).
                                     super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                     super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(args->data).
                                     super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                     super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) *
                             0x4ec4ec4ec4ec4ec5));
  }
  StandardLeastGreatest<false>::FinalizeResult(args->count,local_838,result,state);
  Vector::SetVectorType(result,vector_type_p);
  return;
}

Assistant:

static void LeastGreatestFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	if (args.ColumnCount() == 1) {
		// single input: nop
		result.Reference(args.data[0]);
		return;
	}
	auto &input = BASE_OP::Prepare(args, state);
	auto &result_vector = BASE_OP::TargetVector(result, state);

	auto result_type = VectorType::CONSTANT_VECTOR;
	for (idx_t col_idx = 0; col_idx < input.ColumnCount(); col_idx++) {
		if (args.data[col_idx].GetVectorType() != VectorType::CONSTANT_VECTOR) {
			// non-constant input: result is not a constant vector
			result_type = VectorType::FLAT_VECTOR;
		}
		if (BASE_OP::IS_STRING) {
			// for string vectors we add a reference to the heap of the children
			StringVector::AddHeapReference(result_vector, input.data[col_idx]);
		}
	}

	auto result_data = FlatVector::GetData<T>(result_vector);
	bool result_has_value[STANDARD_VECTOR_SIZE] {false};
	// perform the operation column-by-column
	for (idx_t col_idx = 0; col_idx < input.ColumnCount(); col_idx++) {
		if (input.data[col_idx].GetVectorType() == VectorType::CONSTANT_VECTOR &&
		    ConstantVector::IsNull(input.data[col_idx])) {
			// ignore null vector
			continue;
		}

		UnifiedVectorFormat vdata;
		input.data[col_idx].ToUnifiedFormat(input.size(), vdata);

		auto input_data = UnifiedVectorFormat::GetData<T>(vdata);
		if (!vdata.validity.AllValid()) {
			// potential new null entries: have to check the null mask
			for (idx_t i = 0; i < input.size(); i++) {
				auto vindex = vdata.sel->get_index(i);
				if (vdata.validity.RowIsValid(vindex)) {
					// not a null entry: perform the operation and add to new set
					auto ivalue = input_data[vindex];
					if (!result_has_value[i] || OP::template Operation<T>(ivalue, result_data[i])) {
						result_has_value[i] = true;
						result_data[i] = ivalue;
					}
				}
			}
		} else {
			// no new null entries: only need to perform the operation
			for (idx_t i = 0; i < input.size(); i++) {
				auto vindex = vdata.sel->get_index(i);

				auto ivalue = input_data[vindex];
				if (!result_has_value[i] || OP::template Operation<T>(ivalue, result_data[i])) {
					result_has_value[i] = true;
					result_data[i] = ivalue;
				}
			}
		}
	}
	BASE_OP::FinalizeResult(input.size(), result_has_value, result, state);
	result.SetVectorType(result_type);
}